

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

void __thiscall
Js::FunctionProxy::RegisterFunctionObjectType(FunctionProxy *this,ScriptFunctionType *functionType)

{
  Recycler *recycler;
  code *pcVar1;
  bool bVar2;
  FunctionTypeWeakRefList *this_00;
  undefined4 *puVar3;
  RecyclerWeakReferenceBase *local_38;
  FunctionTypeWeakRef *weakRef;
  
  this_00 = EnsureFunctionObjectTypeList(this);
  if (((this->deferredPrototypeType).ptr == functionType) ||
     ((this->undeferredFunctionType).ptr == functionType)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x882,
                                "(functionType != deferredPrototypeType && functionType != undeferredFunctionType)"
                                ,
                                "functionType != deferredPrototypeType && functionType != undeferredFunctionType"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  recycler = this->m_scriptContext->recycler;
  local_38 = Memory::WeakReferenceHashTable<PrimePolicy>::Add
                       (&recycler->weakReferenceMap,(char *)functionType,recycler);
  if (local_38->typeInfo == (Type)0x0) {
    local_38->typeInfo = (Type)&ScriptFunctionType::typeinfo;
    Memory::Recycler::TrackAllocWeakRef(recycler,local_38);
  }
  JsUtil::
  List<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>
  ::SetAtFirstFreeSpot(this_00,(RecyclerWeakReference<Js::ScriptFunctionType> **)&local_38);
  Output::Trace(ExpirableCollectPhase,L"Registered type 0x%p on function body %p, count = %d\n",
                functionType,this,
                (ulong)(uint)(this_00->
                             super_ReadOnlyList<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_DefaultComparer>
                             ).count);
  return;
}

Assistant:

void FunctionProxy::RegisterFunctionObjectType(ScriptFunctionType* functionType)
    {
        FunctionTypeWeakRefList* typeList = EnsureFunctionObjectTypeList();

        Assert(functionType != deferredPrototypeType && functionType != undeferredFunctionType);
        Recycler * recycler = this->GetScriptContext()->GetRecycler();
        FunctionTypeWeakRef* weakRef = recycler->CreateWeakReferenceHandle(functionType);
        typeList->SetAtFirstFreeSpot(weakRef);
        OUTPUT_TRACE(Js::ExpirableCollectPhase, _u("Registered type 0x%p on function body %p, count = %d\n"), functionType, this, typeList->Count());
    }